

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

bool __thiscall PowerPos<0,_0,_0>::propagate_case_one(PowerPos<0,_0,_0> *this)

{
  bool bVar1;
  int64_t iVar2;
  IntView<0> *in_RDI;
  Reason m_r_3;
  int64_t m_v_3;
  Reason m_r_2;
  int64_t m_v_2;
  Reason m_r_1;
  int64_t m_v_1;
  Reason m_r;
  int64_t m_v;
  IntView<0> *in_stack_ffffffffffffff70;
  Lit in_stack_ffffffffffffff78;
  Lit in_stack_ffffffffffffff7c;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff80;
  Reason *in_stack_ffffffffffffff88;
  Reason *this_00;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff90;
  anon_union_8_2_743a5d44_for_Reason_0 local_60;
  undefined8 local_58;
  anon_union_8_2_743a5d44_for_Reason_0 local_50;
  int local_48;
  int local_44;
  anon_union_8_2_743a5d44_for_Reason_0 local_40;
  undefined8 local_38;
  anon_union_8_2_743a5d44_for_Reason_0 local_30;
  int local_28;
  int local_24;
  anon_union_8_2_743a5d44_for_Reason_0 local_20;
  undefined8 local_18;
  
  iVar2 = IntView<0>::getMin(in_stack_ffffffffffffff70);
  if ((iVar2 == 1) && (iVar2 = IntView<0>::getMax(in_stack_ffffffffffffff70), iVar2 == 1)) {
    local_18 = 1;
    bVar1 = IntView<0>::setMaxNotR(in_stack_ffffffffffffff70,(int64_t)in_RDI);
    if (bVar1) {
      Reason::Reason((Reason *)&local_20,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        local_24 = (int)IntView<0>::getMinLit(in_RDI);
        local_28 = (int)IntView<0>::getMaxLit(in_RDI);
        Reason::Reason(in_stack_ffffffffffffff88,
                       (Lit)(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                       (Lit)(int)in_stack_ffffffffffffff90._a);
      }
      local_30 = local_20;
      bVar1 = IntView<0>::setMax((IntView<0> *)
                                 CONCAT44(in_stack_ffffffffffffff7c.x,in_stack_ffffffffffffff78.x),
                                 (int64_t)in_stack_ffffffffffffff70,
                                 (Reason)in_stack_ffffffffffffff80,SUB81((ulong)in_RDI >> 0x38,0));
      if (!bVar1) {
        return false;
      }
    }
    local_38 = 1;
    bVar1 = IntView<0>::setMinNotR(in_stack_ffffffffffffff70,(int64_t)in_RDI);
    if (bVar1) {
      Reason::Reason((Reason *)&local_40,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        local_44 = (int)IntView<0>::getMinLit(in_RDI);
        local_48 = (int)IntView<0>::getMaxLit(in_RDI);
        Reason::Reason(in_stack_ffffffffffffff88,
                       (Lit)(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                       (Lit)(int)in_stack_ffffffffffffff90._a);
      }
      local_50 = local_40;
      bVar1 = IntView<0>::setMin((IntView<0> *)
                                 CONCAT44(in_stack_ffffffffffffff7c.x,in_stack_ffffffffffffff78.x),
                                 (int64_t)in_stack_ffffffffffffff70,
                                 (Reason)in_stack_ffffffffffffff80,SUB81((ulong)in_RDI >> 0x38,0));
      if (!bVar1) {
        return false;
      }
    }
  }
  iVar2 = IntView<0>::getMin(in_stack_ffffffffffffff70);
  if ((iVar2 == 1) && (iVar2 = IntView<0>::getMax(in_stack_ffffffffffffff70), iVar2 == 1)) {
    local_58 = 1;
    bVar1 = IntView<0>::setMaxNotR(in_stack_ffffffffffffff70,(int64_t)in_RDI);
    if (bVar1) {
      Reason::Reason((Reason *)&local_60,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        IntView<0>::getMinLit(in_RDI);
        IntView<0>::getMaxLit(in_RDI);
        Reason::Reason(in_stack_ffffffffffffff88,
                       (Lit)(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                       (Lit)(int)in_stack_ffffffffffffff90._a);
      }
      bVar1 = IntView<0>::setMax((IntView<0> *)
                                 CONCAT44(in_stack_ffffffffffffff7c.x,in_stack_ffffffffffffff78.x),
                                 (int64_t)in_stack_ffffffffffffff70,
                                 (Reason)in_stack_ffffffffffffff80,SUB81((ulong)in_RDI >> 0x38,0));
      in_stack_ffffffffffffff90 = local_60;
      if (!bVar1) {
        return false;
      }
    }
    this_00 = (Reason *)0x1;
    bVar1 = IntView<0>::setMinNotR(in_stack_ffffffffffffff70,(int64_t)in_RDI);
    if (bVar1) {
      Reason::Reason((Reason *)&stack0xffffffffffffff80,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        in_stack_ffffffffffffff7c = IntView<0>::getMinLit(in_RDI);
        in_stack_ffffffffffffff78 = IntView<0>::getMaxLit(in_RDI);
        Reason::Reason(this_00,(Lit)(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                       (Lit)(int)in_stack_ffffffffffffff90._a);
      }
      bVar1 = IntView<0>::setMin((IntView<0> *)
                                 CONCAT44(in_stack_ffffffffffffff7c.x,in_stack_ffffffffffffff78.x),
                                 in_stack_ffffffffffffff80._a,(Reason)in_stack_ffffffffffffff80,
                                 SUB81((ulong)in_RDI >> 0x38,0));
      if (!bVar1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool propagate_case_one() {
		// x -> z
		if (x.getMin() == 1 && x.getMax() == 1) {
			setDom(z, setMax, 1, x.getMinLit(), x.getMaxLit());
			setDom(z, setMin, 1, x.getMinLit(), x.getMaxLit());
		}
		// z -> x
		if (z.getMin() == 1 && z.getMax() == 1) {
			setDom(x, setMax, 1, z.getMinLit(), z.getMaxLit());
			setDom(x, setMin, 1, z.getMinLit(), z.getMaxLit());
		}
		return true;
	}